

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

void detect(yolo_image *img,ggml_cgraph *gf,yolo_model *model,float thresh,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *labels,vector<yolo_image,_std::allocator<yolo_image>_> *alphabet)

{
  float fVar1;
  float x1;
  float w1;
  float w1_00;
  float w2;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pfVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ggml_tensor *pgVar16;
  ulong uVar17;
  pointer pdVar18;
  int x;
  int i;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
  __comp;
  ulong uVar19;
  vector<float,_std::allocator<float>_> *pvVar20;
  uint uVar21;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __i;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> _Var22;
  vector<float,_std::allocator<float>_> *pvVar23;
  pointer pdVar24;
  int y1;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float i_1;
  int iVar33;
  int y2;
  int iVar34;
  int iVar35;
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  initializer_list<float> __l_02;
  allocator_type local_239;
  float local_238;
  float local_234;
  float local_230;
  allocator_type local_229;
  vector<detection,_std::allocator<detection>_> detections;
  string labelstr;
  float rgb [3];
  undefined1 local_158 [16];
  _Vector_base<float,_std::allocator<float>_> local_148;
  undefined8 uStack_130;
  undefined8 local_11c;
  undefined4 local_114;
  yolo_image sized;
  yolo_layer yolo23;
  yolo_layer yolo16;
  
  detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238 = thresh;
  letterbox_image(&sized,img,model->width,model->height);
  uVar14 = ggml_graph_get_tensor(gf,"input");
  uVar15 = ggml_nbytes(uVar14);
  ggml_backend_tensor_set
            (uVar14,sized.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,0,uVar15);
  iVar12 = ggml_backend_graph_compute(model->backend,gf);
  if (iVar12 == 0) {
    pgVar16 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_15");
    rgb[0] = 4.2039e-45;
    rgb[1] = 5.60519e-45;
    rgb[2] = 7.00649e-45;
    __l._M_len = 3;
    __l._M_array = (iterator)rgb;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_158,__l,(allocator_type *)&local_11c);
    yolo23.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x4329000043070000;
    yolo23.anchors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x439f800043ac0000;
    yolo23.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x4268000042140000;
    yolo23.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x42a4000042a20000;
    yolo23.classes = 0x41200000;
    yolo23._4_4_ = 0x41600000;
    yolo23.mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x41d8000041b80000;
    __l_00._M_len = 0xc;
    __l_00._M_array = (iterator)&yolo23;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&labelstr,__l_00,&local_239);
    yolo_layer::yolo_layer
              (&yolo16,0x50,(vector<int,_std::allocator<int>_> *)local_158,
               (vector<float,_std::allocator<float>_> *)&labelstr,pgVar16);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&labelstr);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_158);
    apply_yolo(&yolo16);
    get_yolo_detections(&yolo16,&detections,img->w,img->h,model->width,model->height,local_238);
    pgVar16 = (ggml_tensor *)ggml_graph_get_tensor(gf,"layer_22");
    local_11c = 0x100000000;
    local_114 = 2;
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)&local_11c;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&labelstr,__l_01,(allocator_type *)&local_239);
    local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4329000043070000;
    uStack_130 = 0x439f800043ac0000;
    local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x4268000042140000;
    local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x42a4000042a20000;
    local_158._0_8_ = (pointer)0x4160000041200000;
    local_158._8_8_ = (pointer)0x41d8000041b80000;
    __l_02._M_len = 0xc;
    __l_02._M_array = (iterator)local_158;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)rgb,__l_02,&local_229);
    yolo_layer::yolo_layer
              (&yolo23,0x50,(vector<int,_std::allocator<int>_> *)&labelstr,
               (vector<float,_std::allocator<float>_> *)rgb,pgVar16);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)rgb);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&labelstr);
    apply_yolo(&yolo23);
    get_yolo_detections(&yolo23,&detections,img->w,img->h,model->width,model->height,local_238);
    uVar21 = yolo23.classes;
    uVar13 = (int)(((long)detections.super__Vector_base<detection,_std::allocator<detection>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)detections.super__Vector_base<detection,_std::allocator<detection>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x30) - 1;
    for (iVar12 = 0; lVar28 = (long)(int)uVar13, iVar12 <= (int)uVar13; iVar12 = iVar12 + 1) {
      if ((detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12].objectness == 0.0) &&
         (!NAN(detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
               super__Vector_impl_data._M_start[iVar12].objectness))) {
        std::swap<detection>
                  (detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar12,
                   detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar28);
        uVar13 = uVar13 - 1;
        iVar12 = iVar12 + -1;
      }
    }
    uVar19 = 0;
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    lVar27 = -1;
    if (-1 < lVar28) {
      lVar27 = lVar28;
    }
    for (; pdVar24 = detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                     super__Vector_impl_data._M_start, uVar19 != uVar21; uVar19 = uVar19 + 1) {
      _Var22._M_current =
           detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
           super__Vector_impl_data._M_start + lVar28 + 1;
      if (detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
          super__Vector_impl_data._M_start != _Var22._M_current) {
        lVar25 = (long)_Var22._M_current -
                 (long)detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar17 = lVar25 / 0x30;
        lVar29 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar29 == 0; lVar29 = lVar29 + -1) {
          }
        }
        __comp._M_comp.k = SUB84(uVar19,0);
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                  ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                    )detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                     super__Vector_impl_data._M_start,_Var22,
                   (ulong)(((uint)lVar29 ^ 0x3f) * 2) ^ 0x7e,__comp);
        if (lVar25 < 0x301) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                    ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                      )pdVar24,_Var22,__comp);
        }
        else {
          _Var22._M_current = pdVar24 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Iter_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                    ((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
                      )pdVar24,_Var22,__comp);
          for (lVar29 = lVar28 * 0x30 + -0x2d0; lVar29 != 0; lVar29 = lVar29 + -0x30) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,__gnu_cxx::__ops::_Val_comp_iter<do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>>
                      (_Var22,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]ggml_examples_yolo_yolov3_tiny_cpp:339:53)>
                               )__comp._M_comp.k);
            _Var22._M_current = _Var22._M_current + 1;
          }
        }
      }
      pdVar24 = detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar20 = &detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                 super__Vector_impl_data._M_start[1].prob;
      uVar17 = (ulong)uVar13;
      for (lVar29 = 0; lVar29 != lVar27 + 1; lVar29 = lVar29 + 1) {
        fVar1 = pdVar24[lVar29].prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          pdVar18 = pdVar24 + lVar29;
          fVar1 = (pdVar18->bbox).x;
          x1 = (pdVar18->bbox).y;
          w1 = (pdVar18->bbox).w;
          w1_00 = (pdVar18->bbox).h;
          pvVar23 = pvVar20;
          uVar26 = uVar17;
          while (bVar30 = uVar26 != 0, uVar26 = uVar26 - 1, bVar30) {
            local_234 = *(float *)((long)(pvVar23 + -1) + 0xc);
            local_230 = *(float *)((long)(pvVar23 + -1) + 0x10);
            w2 = *(float *)((long)(pvVar23 + -1) + 0x14);
            fVar31 = overlap(fVar1,w1,*(float *)((long)(pvVar23 + -1) + 8),local_230);
            fVar32 = overlap(x1,w1_00,local_234,w2);
            fVar31 = (float)(~-(uint)(fVar31 < 0.0) &
                            ~-(uint)(fVar32 < 0.0) & (uint)(fVar31 * fVar32));
            if (0.45 < fVar31 / ((local_230 * w2 + w1 * w1_00) - fVar31)) {
              (pvVar23->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar19] = 0.0;
            }
            pvVar23 = pvVar23 + 2;
          }
        }
        uVar17 = uVar17 - 1;
        pvVar20 = pvVar20 + 2;
      }
    }
    pbVar7 = (labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = (labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar28 = 0;
    while( true ) {
      if ((int)(((long)detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x30) <= lVar28) break;
      labelstr._M_dataplus._M_p = (pointer)&labelstr.field_2;
      labelstr._M_string_length = 0;
      labelstr.field_2._M_local_buf[0] = '\0';
      lVar27 = 0;
      uVar17 = 0;
      uVar19 = 0xffffffffffffffff;
      pdVar24 = detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                super__Vector_impl_data._M_start;
      while( true ) {
        pfVar9 = pdVar24[lVar28].prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = (int)uVar19;
        if ((long)(int)((ulong)((long)pdVar24[lVar28].prob.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pfVar9) >> 2) <=
            (long)uVar17) break;
        if (local_238 < pfVar9[uVar17]) {
          if (iVar12 < 0) {
            std::__cxx11::string::_M_assign((string *)&labelstr);
            uVar19 = uVar17 & 0xffffffff;
          }
          else {
            std::__cxx11::string::append((char *)&labelstr);
            std::__cxx11::string::append((string *)&labelstr);
          }
          printf("%s: %.0f%%\n",
                 SUB84((double)(detections.super__Vector_base<detection,_std::allocator<detection>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar28].prob.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar17] * 100.0),0),
                 *(undefined8 *)
                  ((long)&(((labels->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar27)
                );
          pdVar24 = detections.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        uVar17 = uVar17 + 1;
        lVar27 = lVar27 + 0x20;
      }
      if (-1 < iVar12) {
        pdVar24 = pdVar24 + lVar28;
        iVar33 = (int)((ulong)((long)pbVar7 - (long)pbVar8) >> 5);
        x = (iVar12 * 0x1e241) % iVar33;
        local_230 = get_color(2,x,iVar33);
        local_234 = get_color(1,x,iVar33);
        rgb[2] = get_color(0,x,iVar33);
        rgb[1] = local_234;
        rgb[0] = local_230;
        uVar6 = img->w;
        uVar10 = img->h;
        fVar1 = (float)(int)uVar10;
        uVar2 = (pdVar24->bbox).x;
        uVar4 = (pdVar24->bbox).y;
        uVar3 = (pdVar24->bbox).w;
        uVar5 = (pdVar24->bbox).h;
        iVar12 = (int)(((float)uVar2 - (float)uVar3 * 0.5) * (float)(int)uVar6);
        y1 = (int)(((float)uVar4 - (float)uVar5 * 0.5) * fVar1);
        iVar33 = (int)(((float)uVar3 * 0.5 + (float)uVar2) * (float)(int)uVar6);
        y2 = (int)(((float)uVar5 * 0.5 + (float)uVar4) * fVar1);
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        iVar34 = -(uint)(iVar33 < (int)uVar6);
        iVar35 = -(uint)(y2 < (int)uVar10);
        auVar11._4_4_ = iVar34;
        auVar11._0_4_ = iVar34;
        auVar11._8_4_ = iVar35;
        auVar11._12_4_ = iVar35;
        uVar21 = movmskpd(x,auVar11);
        if ((uVar21 & 1) == 0) {
          iVar33 = uVar6 + -1;
        }
        if (y1 < 1) {
          y1 = 0;
        }
        if ((uVar21 & 2) == 0) {
          y2 = uVar10 + -1;
        }
        draw_box_width(img,iVar12,y1,iVar33,y2,(int)(fVar1 * 0.006),local_230,local_234,rgb[2]);
        get_label((yolo_image *)local_158,alphabet,&labelstr,(int)((double)img->h * 0.03));
        draw_label(img,y1 + (int)(fVar1 * 0.006),iVar12,(yolo_image *)local_158,rgb);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_148);
      }
      std::__cxx11::string::~string((string *)&labelstr);
      lVar28 = lVar28 + 1;
    }
    yolo_layer::~yolo_layer(&yolo23);
    yolo_layer::~yolo_layer(&yolo16);
  }
  else {
    fprintf(_stderr,"%s: ggml_backend_graph_compute() failed\n","detect");
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&sized.data.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<detection,_std::allocator<detection>_>::~vector(&detections);
  return;
}

Assistant:

void detect(yolo_image & img, struct ggml_cgraph * gf, const yolo_model & model, float thresh, const std::vector<std::string> & labels, const std::vector<yolo_image> & alphabet)
{
    std::vector<detection> detections;
    yolo_image sized = letterbox_image(img, model.width, model.height);
    struct ggml_tensor * input = ggml_graph_get_tensor(gf, "input");
    ggml_backend_tensor_set(input, sized.data.data(), 0, ggml_nbytes(input));

    if (ggml_backend_graph_compute(model.backend, gf) != GGML_STATUS_SUCCESS) {
        fprintf(stderr, "%s: ggml_backend_graph_compute() failed\n", __func__);
        return;
    }

    struct ggml_tensor * layer_15 = ggml_graph_get_tensor(gf, "layer_15");
    yolo_layer yolo16{ 80, {3, 4, 5}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_15};
    apply_yolo(yolo16);
    get_yolo_detections(yolo16, detections, img.w, img.h, model.width, model.height, thresh);

    struct ggml_tensor * layer_22 = ggml_graph_get_tensor(gf, "layer_22");
    yolo_layer yolo23{ 80, {0, 1, 2}, {10, 14, 23, 27, 37,58, 81, 82, 135, 169, 344, 319}, layer_22};
    apply_yolo(yolo23);
    get_yolo_detections(yolo23, detections, img.w, img.h, model.width, model.height, thresh);

    do_nms_sort(detections, yolo23.classes, .45);
    draw_detections(img, detections, thresh, labels, alphabet);
}